

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O1

void __thiscall csv::CSVStat::CSVStat(CSVStat *this,string_view filename,CSVFormat *format)

{
  CSVFormat local_88;
  
  memset(this,0,0xa8);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_88.possible_delimiters,&format->possible_delimiters);
  std::vector<char,_std::allocator<char>_>::vector(&local_88.trim_chars,&format->trim_chars);
  local_88.no_quote = format->no_quote;
  local_88.quote_char = format->quote_char;
  local_88.header = format->header;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88.col_names,&format->col_names);
  local_88.variable_column_policy = format->variable_column_policy;
  CSVReader::CSVReader(&this->reader,filename,&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88.col_names);
  if (local_88.trim_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.trim_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.trim_chars.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.trim_chars.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.possible_delimiters.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.possible_delimiters.super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.possible_delimiters.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.possible_delimiters.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>::_M_initialize_map
            (&(this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>,0);
  calc(this);
  return;
}

Assistant:

CSV_INLINE CSVStat::CSVStat(csv::string_view filename, CSVFormat format) :
        reader(filename, format) {
        this->calc();
    }